

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

bool spvIsValidID(char *textValue)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar1 = textValue[lVar3];
    if (cVar1 != '_') {
      if (cVar1 == '\0') {
        return lVar3 != 0;
      }
      iVar2 = isalnum((int)cVar1);
      if (iVar2 == 0) {
        return false;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool spvIsValidID(const char* textValue) {
  const char* c = textValue;
  for (; *c != '\0'; ++c) {
    if (!spvIsValidIDCharacter(*c)) {
      return false;
    }
  }
  // If the string was empty, then the ID also is not valid.
  return c != textValue;
}